

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

unsigned_long
libssh2_channel_window_read_ex
          (LIBSSH2_CHANNEL *channel,unsigned_long *read_avail,unsigned_long *window_size_initial)

{
  char cVar1;
  uint uVar2;
  list_node *plStack_38;
  uchar packet_type;
  LIBSSH2_PACKET *packet;
  size_t bytes_queued;
  unsigned_long *window_size_initial_local;
  unsigned_long *read_avail_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local = (LIBSSH2_CHANNEL *)0x0;
  }
  else {
    if (window_size_initial != (unsigned_long *)0x0) {
      *window_size_initial = (ulong)(channel->remote).window_size_initial;
    }
    if (read_avail != (unsigned_long *)0x0) {
      packet = (LIBSSH2_PACKET *)0x0;
      for (plStack_38 = (list_node *)_libssh2_list_first(&channel->session->packets);
          plStack_38 != (list_node *)0x0; plStack_38 = (list_node *)_libssh2_list_next(plStack_38))
      {
        cVar1 = *(char *)&(plStack_38[1].next)->next;
        if ((cVar1 == '^') || (cVar1 == '_')) {
          uVar2 = _libssh2_ntohu32((uchar *)((long)&(plStack_38[1].next)->next + 1));
          if (uVar2 == (channel->local).id) {
            packet = (LIBSSH2_PACKET *)
                     (((long)plStack_38[1].prev - (long)plStack_38[1].head) + (long)packet);
          }
        }
      }
      *read_avail = (unsigned_long)packet;
    }
    channel_local = (LIBSSH2_CHANNEL *)(ulong)(channel->remote).window_size;
  }
  return (unsigned_long)channel_local;
}

Assistant:

LIBSSH2_API unsigned long
libssh2_channel_window_read_ex(LIBSSH2_CHANNEL *channel,
                               unsigned long *read_avail,
                               unsigned long *window_size_initial)
{
    if(!channel)
        return 0; /* no channel, no window! */

    if (window_size_initial) {
        *window_size_initial = channel->remote.window_size_initial;
    }

    if (read_avail) {
        size_t bytes_queued = 0;
        LIBSSH2_PACKET *packet =
            _libssh2_list_first(&channel->session->packets);

        while (packet) {
            unsigned char packet_type = packet->data[0];

            if (((packet_type == SSH_MSG_CHANNEL_DATA)
                 || (packet_type == SSH_MSG_CHANNEL_EXTENDED_DATA))
                && (_libssh2_ntohu32(packet->data + 1) == channel->local.id)) {
                bytes_queued += packet->data_len - packet->data_head;
            }

            packet = _libssh2_list_next(&packet->node);
        }

        *read_avail = bytes_queued;
    }

    return channel->remote.window_size;
}